

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  bin_writer<3> f;
  int iVar2;
  char *in_RDI;
  string_view sVar3;
  size_t unaff_retaddr;
  format_specs in_stack_00000010;
  int num_digits;
  undefined1 local_48 [36];
  int in_stack_ffffffffffffffdc;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *this_00;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  char *pcVar5;
  
  pcVar5 = in_RDI;
  iVar2 = count_digits<3u,unsigned_long>(*(unsigned_long *)(in_RDI + 0x10));
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) && (*(long *)(in_RDI + 0x10) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x18] = '0';
  }
  sVar3 = get_prefix((int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_> *)
                     0x22e246);
  this_00 = (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar3.data_;
  sVar4 = sVar3.size_;
  memcpy(local_48,*(void **)(in_RDI + 8),0x24);
  sVar3.size_ = unaff_retaddr;
  sVar3.data_ = pcVar5;
  f.num_digits = in_stack_fffffffffffffff0;
  f.abs_value = sVar4;
  f._12_4_ = iVar2;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            (this_00,in_stack_ffffffffffffffdc,sVar3,in_stack_00000010,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }